

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_field_sample_generated.h
# Opt level: O1

int __thiscall keyfield::sample::Apple::KeyCompareWithValue(Apple *this,Color *_color)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  int in_EAX;
  long lVar5;
  
  lVar5 = 0;
  do {
    fVar1 = (this->color_).rgb_[lVar5];
    fVar2 = _color->rgb_[lVar5];
    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
      in_EAX = (uint)(fVar2 < fVar1) - (uint)(fVar1 < fVar2);
    }
    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) goto LAB_00169552;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  in_EAX = 0;
LAB_00169552:
  if (in_EAX == 0) {
    bVar3 = _color->tag_;
    in_EAX = 0;
    bVar4 = (this->color_).tag_;
    if (bVar4 != bVar3) {
      return (uint)(bVar4 >= bVar3 && bVar4 != bVar3) - (uint)(bVar4 < bVar3);
    }
  }
  return in_EAX;
}

Assistant:

int KeyCompareWithValue(const keyfield::sample::Color &_color) const {
    const auto &lhs_color = color();
    const auto &rhs_color = _color;
    const auto rhs_color_rgb = rhs_color.rgb();
    const auto rgb_compare_result = lhs_color.KeyCompareWithValue(rhs_color_rgb);
    if (rgb_compare_result != 0)
      return rgb_compare_result;
    const auto lhs_color_tag = lhs_color.tag();
    const auto rhs_color_tag = rhs_color.tag();
    if (lhs_color_tag != rhs_color_tag)
      return static_cast<int>(lhs_color_tag > rhs_color_tag) - static_cast<int>(lhs_color_tag < rhs_color_tag);
    return 0;
  }